

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_miniz.h
# Opt level: O2

tinfl_status
tinfl_decompress(tinfl_decompressor *r,mz_uint8 *pIn_buf_next,size_t *pIn_buf_size,
                mz_uint8 *pOut_buf_start,mz_uint8 *pOut_buf_next,size_t *pOut_buf_size,
                mz_uint32 decomp_flags)

{
  uint *puVar1;
  ushort uVar2;
  short sVar3;
  bool bVar4;
  bool bVar5;
  tinfl_huff_table *ptVar6;
  tinfl_status tVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined1 *puVar12;
  mz_uint8 *pmVar13;
  byte bVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  mz_uint8 *pmVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  tinfl_status tVar24;
  ulong uVar25;
  uint uVar26;
  int iVar27;
  ulong uVar28;
  size_t sVar29;
  mz_uint8 *pmVar30;
  mz_uint mVar31;
  uint uVar32;
  uint uVar33;
  long lVar34;
  mz_int16 *__s;
  ulong uVar35;
  ulong uVar36;
  mz_uint8 *pmVar37;
  bool bVar38;
  ulong uStack_140;
  uint local_134;
  ulong local_128;
  size_t local_120;
  mz_uint8 *local_118;
  uint *local_110;
  mz_uint total_syms [16];
  mz_uint next_code [17];
  
  if (pOut_buf_next < pOut_buf_start) {
LAB_00115c9b:
    *pOut_buf_size = 0;
    *pIn_buf_size = 0;
    return TINFL_STATUS_BAD_PARAM;
  }
  pmVar30 = pOut_buf_next + *pOut_buf_size;
  uVar28 = -(ulong)((decomp_flags & 4) != 0) | (ulong)(pmVar30 + ~(ulong)pOut_buf_start);
  if ((uVar28 + 1 & uVar28) != 0) goto LAB_00115c9b;
  tVar7 = r->m_state;
  uVar16 = r->m_num_bits;
  uVar25 = r->m_bit_buf;
  uVar26 = r->m_dist;
  local_128 = (ulong)uVar26;
  uVar15 = r->m_counter;
  uVar35 = (ulong)uVar15;
  local_134 = r->m_num_extra;
  local_120 = r->m_dist_from_out_buf_start;
  bVar38 = false;
  tVar24 = TINFL_STATUS_FAILED;
  local_110 = (uint *)pIn_buf_next;
  local_118 = pOut_buf_next;
  local_128._0_4_ = uVar26;
  if (0x35 < (uint)tVar7) {
switchD_00115c8a_caseD_4:
    bVar4 = false;
    goto LAB_00117251;
  }
  sVar29 = *pIn_buf_size;
  puVar1 = (uint *)(pIn_buf_next + sVar29);
  switch(tVar7) {
  case TINFL_STATUS_DONE:
    r->m_zhdr1 = 0;
    r->m_z_adler32 = 1;
    r->m_zhdr0 = 0;
    r->m_check_adler32 = 1;
    if ((decomp_flags & 1) != 0) {
      if ((long)sVar29 < 1) {
        uVar25 = 0;
        local_134 = 0;
        uVar35 = 0;
        local_128 = 0;
        uVar16 = 0;
        goto LAB_001160c6;
      }
      local_110 = (uint *)(pIn_buf_next + 1);
      r->m_zhdr0 = (uint)*pIn_buf_next;
      uVar25 = 0;
      local_134 = 0;
      uVar35 = 0;
      local_128 = 0;
      uVar16 = 0;
      goto LAB_001160d7;
    }
    uVar25 = 0;
    local_134 = 0;
    local_128 = 0;
    uVar16 = 0;
    goto LAB_00116166;
  case TINFL_STATUS_NEEDS_MORE_INPUT:
    if ((long)sVar29 < 1) {
LAB_001160c6:
      if ((decomp_flags & 2) != 0) {
        bVar38 = true;
        tVar7 = TINFL_STATUS_NEEDS_MORE_INPUT;
        bVar4 = false;
        tVar24 = tVar7;
        break;
      }
      r->m_zhdr0 = 0;
    }
    else {
      r->m_zhdr0 = (uint)*pIn_buf_next;
      local_110 = (uint *)(pIn_buf_next + 1);
    }
LAB_001160d7:
    if (puVar1 <= local_110) goto LAB_001160e0;
LAB_00115d42:
    uVar26 = (uint)(byte)*local_110;
    local_110 = (uint *)((long)local_110 + 1);
LAB_001160ed:
    uVar15 = r->m_zhdr0;
    bVar38 = (uVar15 & 0xf) != 8;
    bVar4 = (uVar26 & 0x20) != 0;
    bVar5 = (uVar15 << 8 | uVar26) % 0x1f != 0;
    r->m_zhdr1 = uVar26;
    tVar7 = 0x24;
    if ((decomp_flags & 4) == 0) {
      uVar35 = 0x100L << ((byte)(uVar15 >> 4) & 0x3f);
      if ((0x8000 < (uint)uVar35 || (bVar38 || (bVar4 || bVar5))) || uVar28 + 1 < uVar35) {
LAB_0011614b:
        uVar35 = 1;
LAB_001163b7:
        bVar38 = false;
        tVar24 = TINFL_STATUS_FAILED;
LAB_0011724d:
        bVar4 = false;
        break;
      }
    }
    else if (bVar38 || (bVar4 || bVar5)) goto LAB_0011614b;
LAB_00116166:
    uVar35 = 0;
    do {
      for (; uVar16 < 3; uVar16 = uVar16 + 8) {
        if (local_110 < puVar1) {
LAB_00115e82:
          uVar36 = (ulong)(byte)*local_110;
          local_110 = (uint *)((long)local_110 + 1);
        }
        else {
LAB_0011649a:
          uVar36 = 0;
          if ((decomp_flags & 2) != 0) {
            tVar7 = TINFL_STATUS_HAS_MORE_OUTPUT|TINFL_STATUS_NEEDS_MORE_INPUT;
            goto LAB_0011724b;
          }
        }
        uVar25 = uVar25 | uVar36 << ((byte)uVar16 & 0x3f);
      }
      uVar15 = (uint)uVar25 & 7;
      r->m_final = uVar15;
      uVar25 = uVar25 >> 3;
      uVar16 = uVar16 - 3;
      uVar26 = uVar15 >> 1;
      r->m_type = uVar26;
      if (1 < uVar15) {
        if (uVar26 == 1) {
          r->m_table_sizes[0] = 0x120;
          r->m_table_sizes[1] = 0x20;
          r->m_tables[1].m_code_size[0] = '\x05';
          r->m_tables[1].m_code_size[1] = '\x05';
          r->m_tables[1].m_code_size[2] = '\x05';
          r->m_tables[1].m_code_size[3] = '\x05';
          r->m_tables[1].m_code_size[4] = '\x05';
          r->m_tables[1].m_code_size[5] = '\x05';
          r->m_tables[1].m_code_size[6] = '\x05';
          r->m_tables[1].m_code_size[7] = '\x05';
          ptVar6 = r->m_tables;
          ptVar6[1].m_code_size[8] = '\x05';
          ptVar6[1].m_code_size[9] = '\x05';
          ptVar6[1].m_code_size[10] = '\x05';
          ptVar6[1].m_code_size[0xb] = '\x05';
          ptVar6[1].m_code_size[0xc] = '\x05';
          ptVar6[1].m_code_size[0xd] = '\x05';
          ptVar6[1].m_code_size[0xe] = '\x05';
          ptVar6[1].m_code_size[0xf] = '\x05';
          ptVar6 = r->m_tables;
          ptVar6[1].m_code_size[0x10] = '\x05';
          ptVar6[1].m_code_size[0x11] = '\x05';
          ptVar6[1].m_code_size[0x12] = '\x05';
          ptVar6[1].m_code_size[0x13] = '\x05';
          ptVar6[1].m_code_size[0x14] = '\x05';
          ptVar6[1].m_code_size[0x15] = '\x05';
          ptVar6[1].m_code_size[0x16] = '\x05';
          ptVar6[1].m_code_size[0x17] = '\x05';
          ptVar6 = r->m_tables;
          ptVar6[1].m_code_size[0x18] = '\x05';
          ptVar6[1].m_code_size[0x19] = '\x05';
          ptVar6[1].m_code_size[0x1a] = '\x05';
          ptVar6[1].m_code_size[0x1b] = '\x05';
          ptVar6[1].m_code_size[0x1c] = '\x05';
          ptVar6[1].m_code_size[0x1d] = '\x05';
          ptVar6[1].m_code_size[0x1e] = '\x05';
          ptVar6[1].m_code_size[0x1f] = '\x05';
          for (lVar34 = 0x48; (int)lVar34 != 0xd8; lVar34 = lVar34 + 1) {
            *(undefined1 *)((long)r->m_table_sizes + lVar34 + -0x2c) = 8;
          }
          puVar12 = (undefined1 *)((long)r->m_table_sizes + lVar34 + -0x2c);
          for (iVar9 = 0x90; iVar9 != 0x100; iVar9 = iVar9 + 1) {
            *puVar12 = 9;
            puVar12 = puVar12 + 1;
          }
          for (lVar34 = 0; (int)lVar34 != 0x18; lVar34 = lVar34 + 1) {
            puVar12[lVar34] = 7;
          }
          for (lVar23 = 0; (int)lVar23 != 8; lVar23 = lVar23 + 1) {
            puVar12[lVar34 + lVar23] = 8;
          }
        }
        else {
          uVar36 = 0;
          if (uVar26 == 3) {
            tVar7 = 10;
LAB_0011648b:
            goto LAB_001163b7;
          }
          while (uVar26 = (uint)uVar36, uVar26 < 3) {
            bVar14 = "\x05\x05\x04"[uVar36];
            uVar15 = (uint)(char)bVar14;
            if (uVar16 < uVar15) {
              do {
                uVar35 = uVar36;
                if (local_110 < puVar1) {
LAB_00115d89:
                  uVar17 = (ulong)(byte)*local_110;
                  local_110 = (uint *)((long)local_110 + 1);
                  uVar36 = uVar35;
                }
                else {
LAB_001166f9:
                  uVar17 = 0;
                  uVar36 = uVar35;
                  if ((decomp_flags & 2) != 0) {
                    tVar7 = 0xb;
                    goto LAB_0011724b;
                  }
                }
                uVar25 = uVar25 | uVar17 << ((byte)uVar16 & 0x3f);
                uVar16 = uVar16 + 8;
                bVar14 = "\x05\x05\x04"[uVar36];
                uVar15 = (uint)(char)bVar14;
                uVar26 = (uint)uVar36;
              } while (uVar16 < uVar15);
            }
            uVar16 = uVar16 - uVar15;
            r->m_table_sizes[uVar36] =
                 ((uint)uVar25 & ~(-1 << (bVar14 & 0x1f))) +
                 tinfl_decompress::s_min_table_sizes[uVar36];
            uVar25 = uVar25 >> ((byte)uVar15 & 0x3f);
            uVar36 = (ulong)(uVar26 + 1);
          }
          memset(r->m_tables + 2,0,0x120);
          for (uVar35 = 0; (uint)uVar35 < r->m_table_sizes[2]; uVar35 = (ulong)((int)uVar35 + 1)) {
            for (; uVar16 < 3; uVar16 = uVar16 + 8) {
              if (local_110 < puVar1) {
LAB_00115cfe:
                uVar36 = (ulong)(byte)*local_110;
                local_110 = (uint *)((long)local_110 + 1);
              }
              else {
LAB_001169d0:
                uVar36 = 0;
                if ((decomp_flags & 2) != 0) {
                  tVar7 = 0xe;
                  goto LAB_0011724b;
                }
              }
              uVar25 = uVar25 | uVar36 << ((byte)uVar16 & 0x3f);
            }
            bVar14 = (byte)uVar25;
            uVar25 = uVar25 >> 3;
            uVar16 = uVar16 - 3;
            r->m_tables[2].m_code_size["\x10\x11\x12"[uVar35]] = bVar14 & 7;
          }
          r->m_table_sizes[2] = 0x13;
        }
        uVar26 = r->m_type;
        while (-1 < (int)uVar26) {
          total_syms[0xc] = 0;
          total_syms[0xd] = 0;
          total_syms[0xe] = 0;
          total_syms[0xf] = 0;
          total_syms[8] = 0;
          total_syms[9] = 0;
          total_syms[10] = 0;
          total_syms[0xb] = 0;
          total_syms[4] = 0;
          total_syms[5] = 0;
          total_syms[6] = 0;
          total_syms[7] = 0;
          total_syms[0] = 0;
          total_syms[1] = 0;
          total_syms[2] = 0;
          total_syms[3] = 0;
          __s = r->m_tables[uVar26].m_look_up;
          memset(__s,0,0xc80);
          uVar15 = r->m_table_sizes[uVar26];
          for (uVar36 = 0; uVar15 != uVar36; uVar36 = uVar36 + 1) {
            total_syms[r->m_tables[uVar26].m_code_size[uVar36]] =
                 total_syms[r->m_tables[uVar26].m_code_size[uVar36]] + 1;
          }
          next_code[0] = 0;
          next_code[1] = 0;
          uVar8 = 0;
          mVar31 = 0;
          for (lVar34 = 0; lVar34 != 0xf; lVar34 = lVar34 + 1) {
            uVar8 = uVar8 + total_syms[lVar34 + 1];
            mVar31 = (mVar31 + total_syms[lVar34 + 1]) * 2;
            next_code[lVar34 + 2] = mVar31;
          }
          if (mVar31 != 0x10000 && 1 < uVar8) {
            tVar7 = 0x23;
            bVar38 = false;
            bVar4 = false;
            tVar24 = TINFL_STATUS_FAILED;
            goto LAB_0011724f;
          }
          uVar8 = 0xffffffff;
          for (uVar36 = 0; uVar36 != uVar15; uVar36 = uVar36 + 1) {
            bVar14 = r->m_tables[uVar26].m_code_size[uVar36];
            uVar17 = (ulong)bVar14;
            if (bVar14 != 0) {
              mVar31 = next_code[uVar17];
              next_code[uVar17] = mVar31 + 1;
              uVar18 = 0;
              uVar33 = (uint)bVar14;
              while( true ) {
                bVar38 = uVar33 == 0;
                uVar33 = uVar33 - 1;
                if (bVar38) break;
                uVar18 = (ulong)((mVar31 & 1) + (uint)uVar18 * 2);
                mVar31 = mVar31 >> 1;
              }
              if (bVar14 < 0xb) {
                for (; uVar18 < 0x400; uVar18 = uVar18 + (1L << (bVar14 & 0x3f))) {
                  __s[uVar18] = (ushort)uVar36 | (ushort)bVar14 << 9;
                }
              }
              else {
                uVar32 = (uint)uVar18 & 0x3ff;
                uVar33 = (uint)__s[uVar32];
                if (__s[uVar32] == 0) {
                  __s[uVar32] = (mz_int16)uVar8;
                  uVar33 = uVar8;
                  uVar8 = uVar8 - 2;
                }
                uVar18 = uVar18 >> 9;
                while( true ) {
                  uVar18 = uVar18 >> 1;
                  iVar9 = ((uint)uVar18 & 1) + ~uVar33;
                  if ((uint)uVar17 < 0xc) break;
                  sVar3 = r->m_tables[uVar26].m_tree[iVar9];
                  uVar33 = (uint)sVar3;
                  if (sVar3 == 0) {
                    r->m_tables[uVar26].m_tree[iVar9] = (mz_int16)uVar8;
                    uVar33 = uVar8;
                    uVar8 = uVar8 - 2;
                  }
                  uVar17 = (ulong)((uint)uVar17 - 1);
                }
                r->m_tables[uVar26].m_tree[iVar9] = (ushort)uVar36;
              }
            }
          }
          uVar36 = 0;
          if (uVar26 == 2) {
            while( true ) {
              uVar26 = r->m_table_sizes[0];
              uVar15 = r->m_table_sizes[1];
              uVar8 = uVar15 + uVar26;
              uVar35 = uVar36;
              if (uVar8 <= (uint)uVar36) break;
              if (uVar16 < 0xf) {
                if ((long)puVar1 - (long)local_110 < 2) {
                  do {
                    uVar2 = r->m_tables[2].m_look_up[(uint)uVar25 & 0x3ff];
                    uVar26 = (uint)(short)uVar2;
                    if ((short)uVar2 < 0) {
                      if (10 < uVar16) {
                        uVar15 = 0xc;
                        do {
                          sVar3 = r->m_tables[2].m_tree
                                  [(long)(int)~uVar26 +
                                   (ulong)((uVar25 >> ((ulong)(uVar15 - 2) & 0x3f) & 1) != 0)];
                          uVar26 = (uint)sVar3;
                          if (-1 < sVar3) break;
                          bVar38 = uVar15 <= uVar16;
                          uVar15 = uVar15 + 1;
                        } while (bVar38);
                        if (-1 < sVar3) break;
                      }
                    }
                    else if ((0x1ff < uVar2) && (uVar26 >> 9 <= uVar16)) break;
                    if (local_110 < puVar1) {
LAB_00115e4c:
                      uVar36 = (ulong)(byte)*local_110;
                      local_110 = (uint *)((long)local_110 + 1);
                    }
                    else {
LAB_0011623e:
                      uVar36 = 0;
                      if ((decomp_flags & 2) != 0) {
                        tVar7 = 0x10;
                        goto LAB_0011724b;
                      }
                    }
                    uVar25 = uVar25 | uVar36 << ((byte)uVar16 & 0x3f);
                    uVar16 = uVar16 + 8;
                  } while (uVar16 < 0xf);
                }
                else {
                  uVar25 = uVar25 | (ulong)*(byte *)((long)local_110 + 1) <<
                                    ((byte)uVar16 + 8 & 0x3f) |
                                    (ulong)(byte)*local_110 << ((byte)uVar16 & 0x3f);
                  local_110 = (uint *)((long)local_110 + 2);
                  uVar16 = uVar16 | 0x10;
                }
              }
              uVar26 = (uint)r->m_tables[2].m_look_up[(uint)uVar25 & 0x3ff];
              local_128 = (ulong)uVar26;
              if ((int)uVar26 < 0) {
                uVar36 = 10;
                do {
                  uVar15 = (int)uVar36 + 1;
                  uVar26 = (uint)r->m_tables[2].m_tree
                                 [(long)(int)~(uint)local_128 +
                                  (ulong)((uVar25 >> (uVar36 & 0x3f) & 1) != 0)];
                  local_128 = (ulong)uVar26;
                  uVar36 = (ulong)uVar15;
                } while ((int)uVar26 < 0);
              }
              else {
                uVar15 = uVar26 >> 9;
                local_128 = (ulong)(uVar26 & 0x1ff);
              }
              uVar25 = uVar25 >> ((byte)uVar15 & 0x3f);
              uVar16 = uVar16 - uVar15;
              uVar26 = (uint)local_128;
              if (uVar26 < 0x10) {
                uVar36 = (ulong)((int)uVar35 + 1);
                r->m_len_codes[uVar35] = (mz_uint8)local_128;
              }
              else {
                if ((uVar26 == 0x10) && ((int)uVar35 == 0)) {
                  uVar35 = 0;
                  local_128._0_4_ = 0x10;
                  tVar7 = 0x11;
                  goto LAB_001163b7;
                }
                uVar36 = (ulong)(uVar26 - 0x10);
                local_134 = (uint)"\x02\x03\a"[uVar36];
                if (uVar16 < local_134) {
                  do {
                    if (local_110 < puVar1) {
LAB_00115f80:
                      uVar36 = (ulong)(byte)*local_110;
                      local_110 = (uint *)((long)local_110 + 1);
                    }
                    else {
LAB_00116bb4:
                      uVar36 = 0;
                      if ((decomp_flags & 2) != 0) {
                        tVar7 = 0x12;
                        goto LAB_0011724b;
                      }
                    }
                    uVar25 = uVar36 << ((byte)uVar16 & 0x3f) | uVar25;
                    uVar16 = uVar16 + 8;
                  } while (uVar16 < local_134);
                  uVar36 = (ulong)((int)local_128 - 0x10);
                }
                uVar26 = (uint)uVar25;
                uVar25 = uVar25 >> ((byte)local_134 & 0x3f);
                uVar16 = uVar16 - local_134;
                uVar26 = (int)"\x03\x03\v"[uVar36] + (uVar26 & ~(-1 << ((byte)local_134 & 0x1f)));
                bVar14 = 0;
                if ((uint)local_128 == 0x10) {
                  bVar14 = r->m_len_codes[(int)uVar35 - 1];
                }
                memset(r->m_len_codes + uVar35,(uint)bVar14,(ulong)uVar26);
                uVar36 = (ulong)((int)uVar35 + uVar26);
              }
            }
            if ((uint)uVar36 != uVar8) {
              tVar7 = 0x15;
              bVar38 = false;
              bVar4 = false;
              tVar24 = TINFL_STATUS_FAILED;
              goto LAB_0011724f;
            }
            memcpy(r->m_tables,r->m_len_codes,(ulong)uVar26);
            memcpy(r->m_tables + 1,r->m_len_codes + uVar26,(ulong)uVar15);
            uVar26 = r->m_type;
          }
          uVar26 = uVar26 - 1;
          r->m_type = uVar26;
        }
LAB_00116fb8:
        do {
          uStack_140 = 10;
          while( true ) {
            bVar14 = (byte)uVar16;
            if (((long)puVar1 - (long)local_110 < 4) || ((long)pmVar30 - (long)local_118 < 2))
            break;
            if (uVar16 < 0x1e) {
              uVar25 = uVar25 | (ulong)*local_110 << (bVar14 & 0x3f);
              local_110 = local_110 + 1;
              uVar16 = uVar16 | 0x20;
            }
            uVar26 = (uint)r->m_tables[0].m_look_up[(uint)uVar25 & 0x3ff];
            uVar35 = (ulong)uVar26;
            uVar36 = uStack_140;
            if ((int)uVar26 < 0) {
              do {
                uVar26 = (int)uVar36 + 1;
                uVar15 = (uint)r->m_tables[0].m_tree
                               [(long)(int)~(uint)uVar35 +
                                (ulong)((uVar25 >> (uVar36 & 0x3f) & 1) != 0)];
                uVar35 = (ulong)uVar15;
                uVar36 = (ulong)uVar26;
              } while ((int)uVar15 < 0);
            }
            else {
              uVar26 = uVar26 >> 9;
            }
            uVar25 = uVar25 >> ((byte)uVar26 & 0x3f);
            uVar16 = uVar16 - uVar26;
            uVar26 = (uint)uVar35;
            if ((uVar26 >> 8 & 1) != 0) goto LAB_00116eac;
            uVar26 = (uint)r->m_tables[0].m_look_up[(uint)uVar25 & 0x3ff];
            uVar36 = uStack_140;
            if ((int)uVar26 < 0) {
              do {
                uVar15 = (int)uVar36 + 1;
                uVar26 = (uint)r->m_tables[0].m_tree
                               [(long)(int)~uVar26 + (ulong)((uVar25 >> (uVar36 & 0x3f) & 1) != 0)];
                uVar36 = (ulong)uVar15;
              } while ((int)uVar26 < 0);
            }
            else {
              uVar15 = uVar26 >> 9;
            }
            uVar25 = uVar25 >> ((byte)uVar15 & 0x3f);
            uVar16 = uVar16 - uVar15;
            *local_118 = (mz_uint8)uVar35;
            if ((uVar26 >> 8 & 1) != 0) {
              local_118 = local_118 + 1;
              goto LAB_00116eac;
            }
            local_118[1] = (mz_uint8)uVar26;
            local_118 = local_118 + 2;
          }
          if (uVar16 < 0xf) {
            if ((long)puVar1 - (long)local_110 < 2) {
              do {
                uVar2 = r->m_tables[0].m_look_up[(uint)uVar25 & 0x3ff];
                uVar26 = (uint)(short)uVar2;
                if ((short)uVar2 < 0) {
                  if (10 < uVar16) {
                    uVar15 = 0xc;
                    do {
                      sVar3 = r->m_tables[0].m_tree
                              [(long)(int)~uVar26 +
                               (ulong)((uVar25 >> ((ulong)(uVar15 - 2) & 0x3f) & 1) != 0)];
                      uVar26 = (uint)sVar3;
                      if (-1 < sVar3) break;
                      bVar38 = uVar15 <= uVar16;
                      uVar15 = uVar15 + 1;
                    } while (bVar38);
                    if (-1 < sVar3) break;
                  }
                }
                else if ((0x1ff < uVar2) && (uVar26 >> 9 <= uVar16)) break;
                if (local_110 < puVar1) {
LAB_00115d24:
                  uVar36 = (ulong)(byte)*local_110;
                  local_110 = (uint *)((long)local_110 + 1);
                }
                else {
LAB_00116e28:
                  uVar36 = 0;
                  if ((decomp_flags & 2) != 0) {
                    tVar7 = 0x17;
                    goto LAB_0011724b;
                  }
                }
                uVar25 = uVar25 | uVar36 << ((byte)uVar16 & 0x3f);
                uVar16 = uVar16 + 8;
              } while (uVar16 < 0xf);
            }
            else {
              uVar25 = uVar25 | (ulong)*(byte *)((long)local_110 + 1) << (bVar14 + 8 & 0x3f) |
                                (ulong)(byte)*local_110 << (bVar14 & 0x3f);
              local_110 = (uint *)((long)local_110 + 2);
              uVar16 = uVar16 | 0x10;
            }
          }
          uVar26 = (uint)r->m_tables[0].m_look_up[(uint)uVar25 & 0x3ff];
          uVar35 = (ulong)uVar26;
          if ((int)uVar26 < 0) {
            uVar36 = 10;
            do {
              uVar15 = (int)uVar36 + 1;
              uVar26 = (uint)r->m_tables[0].m_tree
                             [(long)(int)~(uint)uVar35 +
                              (ulong)((uVar25 >> (uVar36 & 0x3f) & 1) != 0)];
              uVar35 = (ulong)uVar26;
              uVar36 = (ulong)uVar15;
            } while ((int)uVar26 < 0);
          }
          else {
            uVar15 = uVar26 >> 9;
            uVar35 = (ulong)(uVar26 & 0x1ff);
          }
          uVar25 = uVar25 >> ((byte)uVar15 & 0x3f);
          uVar16 = uVar16 - uVar15;
          uVar26 = (uint)uVar35;
          if (0xff < uVar26) {
LAB_00116eac:
            uVar35 = 0x100;
            if ((uVar26 & 0x1ff) != 0x100) {
              uVar36 = (ulong)((uVar26 & 0x1ff) - 0x101);
              uVar35 = (ulong)(uint)tinfl_decompress::s_length_base[uVar36];
              local_134 = 0;
              if (0xffffffffffffffeb < uVar36 - 0x1c) {
                local_134 = tinfl_decompress::s_length_extra[uVar36];
                uVar36 = uVar25;
                for (; uVar16 < local_134; uVar16 = uVar16 + 8) {
                  uVar25 = uVar36;
                  if (local_110 < puVar1) {
LAB_00115f60:
                    uVar36 = (ulong)(byte)*local_110;
                    local_110 = (uint *)((long)local_110 + 1);
                  }
                  else {
LAB_001162d9:
                    uVar36 = 0;
                    if ((decomp_flags & 2) != 0) {
                      tVar7 = 0x19;
                      goto LAB_0011724b;
                    }
                  }
                  uVar36 = uVar25 | uVar36 << ((byte)uVar16 & 0x3f);
                }
                uVar25 = uVar36 >> ((byte)local_134 & 0x3f);
                uVar16 = uVar16 - local_134;
                uVar35 = (ulong)(((uint)uVar36 & ~(-1 << ((byte)local_134 & 0x1f))) + (int)uVar35);
              }
              if (uVar16 < 0xf) {
                if ((long)puVar1 - (long)local_110 < 2) {
                  do {
                    uVar2 = r->m_tables[1].m_look_up[(uint)uVar25 & 0x3ff];
                    uVar26 = (uint)(short)uVar2;
                    if ((short)uVar2 < 0) {
                      if (10 < uVar16) {
                        uVar15 = 0xc;
                        do {
                          sVar3 = r->m_tables[1].m_tree
                                  [(long)(int)~uVar26 +
                                   (ulong)((uVar25 >> ((ulong)(uVar15 - 2) & 0x3f) & 1) != 0)];
                          uVar26 = (uint)sVar3;
                          if (-1 < sVar3) break;
                          bVar38 = uVar15 <= uVar16;
                          uVar15 = uVar15 + 1;
                        } while (bVar38);
                        if (-1 < sVar3) break;
                      }
                    }
                    else if ((0x1ff < uVar2) && (uVar26 >> 9 <= uVar16)) break;
                    if (local_110 < puVar1) {
LAB_00115f03:
                      uVar36 = (ulong)(byte)*local_110;
                      local_110 = (uint *)((long)local_110 + 1);
                    }
                    else {
LAB_0011701f:
                      uVar36 = 0;
                      if ((decomp_flags & 2) != 0) {
                        tVar7 = 0x1a;
                        goto LAB_0011724b;
                      }
                    }
                    uVar25 = uVar25 | uVar36 << ((byte)uVar16 & 0x3f);
                    uVar16 = uVar16 + 8;
                  } while (uVar16 < 0xf);
                }
                else {
                  uVar25 = uVar25 | (ulong)*(byte *)((long)local_110 + 1) <<
                                    ((byte)uVar16 + 8 & 0x3f) |
                                    (ulong)(byte)*local_110 << ((byte)uVar16 & 0x3f);
                  local_110 = (uint *)((long)local_110 + 2);
                  uVar16 = uVar16 | 0x10;
                }
              }
              sVar3 = r->m_tables[1].m_look_up[(uint)uVar25 & 0x3ff];
              uVar26 = (uint)sVar3;
              if (sVar3 < 0) {
                uVar36 = 10;
                do {
                  uVar15 = (int)uVar36 + 1;
                  sVar3 = r->m_tables[1].m_tree
                          [(long)(int)~uVar26 + (ulong)((uVar25 >> (uVar36 & 0x3f) & 1) != 0)];
                  uVar26 = (uint)sVar3;
                  uVar36 = (ulong)uVar15;
                } while (sVar3 < 0);
              }
              else {
                uVar15 = uVar26 >> 9;
                uVar26 = uVar26 & 0x1ff;
              }
              uVar25 = uVar25 >> ((byte)uVar15 & 0x3f);
              uVar16 = uVar16 - uVar15;
              uVar36 = (ulong)uVar26;
              local_128 = (ulong)(uint)tinfl_decompress::s_dist_base[uVar36];
              local_134 = 0;
              if (0xffffffffffffffe5 < uVar36 - 0x1e) {
                local_134 = tinfl_decompress::s_dist_extra[uVar36];
                uVar36 = uVar25;
                for (; uVar16 < local_134; uVar16 = uVar16 + 8) {
                  uVar25 = uVar36;
                  if (local_110 < puVar1) {
LAB_00115fa6:
                    uVar36 = (ulong)(byte)*local_110;
                    local_110 = (uint *)((long)local_110 + 1);
                  }
                  else {
LAB_001170d5:
                    uVar36 = 0;
                    if ((decomp_flags & 2) != 0) {
                      tVar7 = 0x1b;
                      goto LAB_0011724b;
                    }
                  }
                  uVar36 = uVar25 | uVar36 << ((byte)uVar16 & 0x3f);
                }
                uVar25 = uVar36 >> ((byte)local_134 & 0x3f);
                local_128 = (ulong)(((uint)uVar36 & ~(-1 << ((byte)local_134 & 0x1f))) +
                                   (uint)local_128);
                uVar16 = uVar16 - local_134;
              }
              local_120 = (long)local_118 - (long)pOut_buf_start;
              if (((decomp_flags & 4) != 0) && (local_120 < local_128)) {
                tVar7 = 0x25;
                goto LAB_0011648b;
              }
              pmVar13 = pOut_buf_start + (local_120 - local_128 & uVar28);
              pmVar19 = pmVar13;
              if (pmVar13 < local_118) {
                pmVar19 = local_118;
              }
              if (pmVar30 < pmVar19 + uVar35) {
                while (iVar9 = (int)uVar35, uVar35 = (ulong)(iVar9 - 1), sVar29 = local_120,
                      iVar9 != 0) {
LAB_001171f3:
                  if (pmVar30 <= local_118) {
                    tVar7 = 0x35;
                    local_120 = sVar29;
                    goto LAB_00116616;
                  }
                  local_120 = sVar29 + 1;
                  *local_118 = pOut_buf_start[sVar29 - local_128 & uVar28];
                  local_118 = local_118 + 1;
                }
                uStack_140 = 0xffffffffffffffff;
                uVar35 = uStack_140;
              }
              else {
                uVar35 = (ulong)((int)uVar35 - 3) + 3;
                do {
                  pmVar37 = local_118;
                  pmVar19 = pmVar13;
                  *pmVar37 = *pmVar19;
                  pmVar37[1] = pmVar19[1];
                  pmVar37[2] = pmVar19[2];
                  local_118 = pmVar37 + 3;
                  uVar35 = uVar35 - 3;
                  iVar9 = (int)uVar35;
                  pmVar13 = pmVar19 + 3;
                } while (2 < iVar9);
                if (0 < iVar9) {
                  *local_118 = pmVar19[3];
                  if (iVar9 == 2) {
                    pmVar37[4] = pmVar19[4];
                  }
                  local_118 = local_118 + uVar35;
                }
              }
              goto LAB_00116fb8;
            }
            goto LAB_00116ec0;
          }
LAB_00116eef:
          if (pmVar30 <= local_118) {
            tVar7 = 0x18;
            goto LAB_00116616;
          }
          *local_118 = (mz_uint8)uVar35;
          local_118 = local_118 + 1;
        } while( true );
      }
LAB_0011630e:
      uVar25 = uVar25 >> ((byte)uVar16 & 7);
      uVar16 = uVar16 & 0xfffffff8;
      uVar35 = 0;
      while( true ) {
        uVar15 = (uint)uVar35;
        if (3 < uVar15) break;
        if (uVar16 == 0) {
          uVar16 = 0;
          if (local_110 < puVar1) {
            uVar16 = *local_110;
            local_110 = (uint *)((long)local_110 + 1);
            r->m_raw_header[uVar35] = (byte)uVar16;
            uVar16 = 0;
          }
          else {
LAB_0011638f:
            uVar15 = (uint)uVar35;
            if ((decomp_flags & 2) != 0) {
              tVar7 = 7;
              goto LAB_0011724b;
            }
            r->m_raw_header[uVar35] = '\0';
          }
        }
        else {
          uVar26 = uVar16;
          if (uVar16 < 8) {
            do {
              if (local_110 < puVar1) {
LAB_00115d68:
                uVar36 = (ulong)(byte)*local_110;
                local_110 = (uint *)((long)local_110 + 1);
              }
              else {
LAB_001164d4:
                uVar36 = 0;
                if ((decomp_flags & 2) != 0) {
                  tVar7 = 6;
                  goto LAB_0011724b;
                }
              }
              uVar25 = uVar25 | uVar36 << ((byte)uVar16 & 0x3f);
              uVar26 = uVar16 + 8;
              bVar38 = 0xfffffff7 < uVar16;
              uVar16 = uVar26;
            } while (bVar38);
          }
          uVar15 = (uint)uVar35;
          r->m_raw_header[uVar35] = (mz_uint8)uVar25;
          uVar25 = uVar25 >> 8;
          uVar16 = uVar26 - 8;
        }
LAB_001163a0:
        uVar35 = (ulong)(uVar15 + 1);
      }
      uVar35 = (ulong)*(ushort *)r->m_raw_header;
      if ((*(ushort *)(r->m_raw_header + 2) ^ *(ushort *)r->m_raw_header) != 0xffff) {
        tVar7 = 0x27;
        goto LAB_001163b7;
      }
      while (((int)uVar35 != 0 && (uVar16 != 0))) {
        uVar26 = uVar16;
        if (uVar16 < 8) {
          do {
            if (local_110 < puVar1) {
LAB_00115fcc:
              uVar36 = (ulong)(byte)*local_110;
              local_110 = (uint *)((long)local_110 + 1);
            }
            else {
LAB_00116628:
              uVar36 = 0;
              if ((decomp_flags & 2) != 0) {
                tVar7 = 0x33;
                goto LAB_0011724b;
              }
            }
            uVar25 = uVar25 | uVar36 << ((byte)uVar16 & 0x3f);
            uVar26 = uVar16 + 8;
            bVar38 = 0xfffffff7 < uVar16;
            uVar16 = uVar26;
          } while (bVar38);
        }
        local_128 = uVar25 & 0xff;
        uVar25 = uVar25 >> 8;
        uVar16 = uVar26 - 8;
LAB_0011653b:
        if (pmVar30 <= local_118) {
          tVar7 = 0x34;
          goto LAB_00116616;
        }
        *local_118 = (mz_uint8)local_128;
        local_118 = local_118 + 1;
        uVar35 = (ulong)((int)uVar35 - 1);
      }
      for (; (int)uVar35 != 0; uVar35 = (ulong)(uint)((int)uVar35 - (int)uVar36)) {
LAB_0011656d:
        if (pmVar30 <= local_118) {
          tVar7 = 9;
LAB_00116616:
          tVar24 = TINFL_STATUS_HAS_MORE_OUTPUT;
          bVar38 = true;
          goto LAB_00116617;
        }
LAB_00116579:
        if (puVar1 <= local_110) {
          if ((decomp_flags & 2) != 0) {
            tVar7 = 0x26;
            goto LAB_0011724b;
          }
          tVar7 = 0x28;
          goto LAB_001163b7;
        }
        uVar36 = (long)puVar1 - (long)local_110;
        if ((ulong)((long)pmVar30 - (long)local_118) < (ulong)((long)puVar1 - (long)local_110)) {
          uVar36 = (long)pmVar30 - (long)local_118;
        }
        if (uVar35 <= uVar36) {
          uVar36 = uVar35;
        }
        memcpy(local_118,local_110,uVar36);
        local_110 = (uint *)((long)local_110 + uVar36);
        local_118 = local_118 + uVar36;
      }
      uVar35 = 0;
LAB_00116ec0:
    } while ((r->m_final & 1) == 0);
    if ((decomp_flags & 1) != 0) {
LAB_00116f7c:
      uVar25 = uVar25 >> ((byte)uVar16 & 7);
      uVar35 = 0;
      uVar8 = uVar16 & 0xfffffff8;
      while( true ) {
        uVar15 = (uint)uVar35;
        uVar16 = uVar8;
        if (3 < uVar15) break;
        if (uVar8 == 0) {
          uVar16 = 0;
          if (local_110 < puVar1) {
            uVar26 = (uint)(byte)*local_110;
            local_110 = (uint *)((long)local_110 + 1);
            uVar16 = 0;
            goto LAB_0011625b;
          }
LAB_001162a6:
          uVar15 = (uint)uVar35;
          uVar26 = 0;
          if ((decomp_flags & 2) == 0) goto LAB_0011625b;
          tVar7 = 0x2a;
LAB_0011724b:
          bVar38 = true;
          tVar24 = TINFL_STATUS_NEEDS_MORE_INPUT;
          goto LAB_0011724d;
        }
        if (uVar8 < 8) {
          do {
            if (local_110 < puVar1) {
LAB_00115ede:
              uVar28 = (ulong)(byte)*local_110;
              local_110 = (uint *)((long)local_110 + 1);
            }
            else {
LAB_0011721b:
              uVar28 = 0;
              if ((decomp_flags & 2) != 0) {
                tVar7 = 0x29;
                goto LAB_0011724b;
              }
            }
            uVar15 = (uint)uVar35;
            uVar25 = uVar25 | uVar28 << ((byte)uVar16 & 0x3f);
            uVar8 = uVar16 + 8;
            bVar38 = 0xfffffff7 < uVar16;
            uVar16 = uVar8;
          } while (bVar38);
        }
        uVar26 = (uint)uVar25 & 0xff;
        uVar25 = uVar25 >> 8;
        uVar16 = uVar8 - 8;
LAB_0011625b:
        r->m_z_adler32 = r->m_z_adler32 << 8 | uVar26;
        uVar35 = (ulong)(uVar15 + 1);
        uVar8 = uVar16;
      }
    }
    tVar7 = 0x22;
LAB_00116ee7:
    bVar38 = true;
    bVar4 = true;
    tVar24 = TINFL_STATUS_DONE;
    break;
  case TINFL_STATUS_HAS_MORE_OUTPUT:
    if (0 < (long)sVar29) goto LAB_00115d42;
LAB_001160e0:
    uVar26 = 0;
    bVar4 = false;
    if ((decomp_flags & 2) == 0) goto LAB_001160ed;
    tVar7 = TINFL_STATUS_HAS_MORE_OUTPUT;
    bVar38 = true;
    tVar24 = TINFL_STATUS_NEEDS_MORE_INPUT;
    break;
  case TINFL_STATUS_HAS_MORE_OUTPUT|TINFL_STATUS_NEEDS_MORE_INPUT:
    if ((long)sVar29 < 1) goto LAB_0011649a;
    goto LAB_00115e82;
  default:
    goto switchD_00115c8a_caseD_4;
  case 5:
    if (0 < (long)sVar29) {
      uVar36 = (ulong)*pIn_buf_next;
      local_110 = (uint *)(pIn_buf_next + 1);
LAB_00116054:
      uVar25 = uVar25 | uVar36 << ((byte)uVar16 & 0x3f);
      uVar16 = uVar16 + 8;
      goto LAB_0011630e;
    }
    uVar36 = 0;
    if ((decomp_flags & 2) == 0) goto LAB_00116054;
    tVar7 = 5;
LAB_001161ae:
    bVar4 = false;
    bVar38 = true;
    tVar24 = TINFL_STATUS_NEEDS_MORE_INPUT;
    break;
  case 6:
    if ((long)sVar29 < 1) goto LAB_001164d4;
    goto LAB_00115d68;
  case 7:
    if ((long)sVar29 < 1) goto LAB_0011638f;
    local_110 = (uint *)(pIn_buf_next + 1);
    r->m_raw_header[uVar35] = *pIn_buf_next;
    goto LAB_001163a0;
  case 9:
    goto LAB_0011656d;
  case 10:
  case 0x11:
  case 0x15:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x27:
  case 0x28:
LAB_00116617:
    bVar4 = false;
    break;
  case 0xb:
    if ((long)sVar29 < 1) goto LAB_001166f9;
    goto LAB_00115d89;
  case 0xe:
    if ((long)sVar29 < 1) goto LAB_001169d0;
    goto LAB_00115cfe;
  case 0x10:
    if ((long)sVar29 < 1) goto LAB_0011623e;
    goto LAB_00115e4c;
  case 0x12:
    if ((long)sVar29 < 1) goto LAB_00116bb4;
    goto LAB_00115f80;
  case 0x17:
    if ((long)sVar29 < 1) goto LAB_00116e28;
    goto LAB_00115d24;
  case 0x18:
    goto LAB_00116eef;
  case 0x19:
    if ((long)sVar29 < 1) goto LAB_001162d9;
    goto LAB_00115f60;
  case 0x1a:
    if ((long)sVar29 < 1) goto LAB_0011701f;
    goto LAB_00115f03;
  case 0x1b:
    if ((long)sVar29 < 1) goto LAB_001170d5;
    goto LAB_00115fa6;
  case 0x20:
    if ((long)sVar29 < 1) {
      uVar28 = 0;
      if ((decomp_flags & 2) != 0) {
        tVar7 = 0x20;
        goto LAB_001161ae;
      }
    }
    else {
      uVar28 = (ulong)*pIn_buf_next;
      local_110 = (uint *)(pIn_buf_next + 1);
    }
    uVar25 = uVar25 | uVar28 << ((byte)uVar16 & 0x3f);
    uVar16 = uVar16 + 8;
    goto LAB_00116f7c;
  case 0x22:
    goto LAB_00116ee7;
  case 0x26:
    goto LAB_00116579;
  case 0x29:
    if ((long)sVar29 < 1) goto LAB_0011721b;
    goto LAB_00115ede;
  case 0x2a:
    if ((long)sVar29 < 1) goto LAB_001162a6;
    local_110 = (uint *)(pIn_buf_next + 1);
    uVar26 = (uint)*pIn_buf_next;
    goto LAB_0011625b;
  case 0x33:
    if ((long)sVar29 < 1) goto LAB_00116628;
    goto LAB_00115fcc;
  case 0x34:
    goto LAB_0011653b;
  case 0x35:
    sVar29 = local_120;
    goto LAB_001171f3;
  }
LAB_0011724f:
  uVar15 = (uint)uVar35;
  r->m_state = tVar7;
LAB_00117251:
  r->m_num_bits = uVar16;
  r->m_bit_buf = uVar25;
  r->m_dist = (uint)local_128;
  r->m_counter = uVar15;
  r->m_num_extra = local_134;
  r->m_dist_from_out_buf_start = local_120;
  *pIn_buf_size = (long)local_110 - (long)pIn_buf_next;
  uVar28 = (long)local_118 - (long)pOut_buf_next;
  *pOut_buf_size = uVar28;
  if (bVar38) {
    uVar26 = r->m_check_adler32 & 0xffff;
    uVar16 = r->m_check_adler32 >> 0x10;
    uVar25 = uVar28 % 0x15b0;
    while (uVar28 != 0) {
      for (lVar34 = 0; (int)lVar34 + 7U < (uint)uVar25; lVar34 = lVar34 + 8) {
        iVar27 = uVar26 + pOut_buf_next[lVar34];
        iVar9 = (uint)pOut_buf_next[lVar34 + 1] + iVar27;
        iVar20 = (uint)pOut_buf_next[lVar34 + 2] + iVar9;
        iVar10 = (uint)pOut_buf_next[lVar34 + 3] + iVar20;
        iVar21 = (uint)pOut_buf_next[lVar34 + 4] + iVar10;
        iVar11 = (uint)pOut_buf_next[lVar34 + 5] + iVar21;
        iVar22 = (uint)pOut_buf_next[lVar34 + 6] + iVar11;
        uVar26 = (uint)pOut_buf_next[lVar34 + 7] + iVar22;
        uVar16 = uVar16 + iVar27 + iVar9 + iVar20 + iVar10 + iVar21 + iVar11 + iVar22 + uVar26;
      }
      for (; (uint)lVar34 < (uint)uVar25; lVar34 = lVar34 + 1) {
        uVar26 = uVar26 + pOut_buf_next[lVar34];
        uVar16 = uVar16 + uVar26;
      }
      uVar26 = uVar26 % 0xfff1;
      uVar16 = uVar16 % 0xfff1;
      pOut_buf_next = pOut_buf_next + lVar34;
      uVar28 = uVar28 - uVar25;
      uVar25 = 0x15b0;
    }
    uVar26 = uVar16 << 0x10 | uVar26;
    r->m_check_adler32 = uVar26;
    if ((bVar4) && (tVar24 = TINFL_STATUS_DONE, (decomp_flags & 1) != 0)) {
      tVar24 = (uint)(uVar26 == r->m_z_adler32) * 2 + TINFL_STATUS_ADLER32_MISMATCH;
    }
  }
  return tVar24;
}

Assistant:

static tinfl_status tinfl_decompress(tinfl_decompressor *r, const mz_uint8 *pIn_buf_next, size_t *pIn_buf_size, mz_uint8 *pOut_buf_start, mz_uint8 *pOut_buf_next, size_t *pOut_buf_size, const mz_uint32 decomp_flags)
{
  static const int s_length_base[31] = { 3,4,5,6,7,8,9,10,11,13, 15,17,19,23,27,31,35,43,51,59, 67,83,99,115,131,163,195,227,258,0,0 };
  static const int s_length_extra[31]= { 0,0,0,0,0,0,0,0,1,1,1,1,2,2,2,2,3,3,3,3,4,4,4,4,5,5,5,5,0,0,0 };
  static const int s_dist_base[32] = { 1,2,3,4,5,7,9,13,17,25,33,49,65,97,129,193, 257,385,513,769,1025,1537,2049,3073,4097,6145,8193,12289,16385,24577,0,0};
  static const int s_dist_extra[32] = { 0,0,0,0,1,1,2,2,3,3,4,4,5,5,6,6,7,7,8,8,9,9,10,10,11,11,12,12,13,13};
  static const mz_uint8 s_length_dezigzag[19] = { 16,17,18,0,8,7,9,6,10,5,11,4,12,3,13,2,14,1,15 };
  static const int s_min_table_sizes[3] = { 257, 1, 4 };

  tinfl_status status = TINFL_STATUS_FAILED; mz_uint32 num_bits, dist, counter, num_extra; tinfl_bit_buf_t bit_buf;
  const mz_uint8 *pIn_buf_cur = pIn_buf_next, *const pIn_buf_end = pIn_buf_next + *pIn_buf_size;
  mz_uint8 *pOut_buf_cur = pOut_buf_next, *const pOut_buf_end = pOut_buf_next + *pOut_buf_size;
  size_t out_buf_size_mask = (decomp_flags & TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF) ? (size_t)-1 : ((pOut_buf_next - pOut_buf_start) + *pOut_buf_size) - 1, dist_from_out_buf_start;

  /* Ensure the output buffer's size is a power of 2, unless the output buffer is large enough to hold the entire output file (in which case it doesn't matter). */
  if (((out_buf_size_mask + 1) & out_buf_size_mask) || (pOut_buf_next < pOut_buf_start)) { *pIn_buf_size = *pOut_buf_size = 0; return TINFL_STATUS_BAD_PARAM; }

  num_bits = r->m_num_bits; bit_buf = r->m_bit_buf; dist = r->m_dist; counter = r->m_counter; num_extra = r->m_num_extra; dist_from_out_buf_start = r->m_dist_from_out_buf_start;
  TINFL_CR_BEGIN

  bit_buf = num_bits = dist = counter = num_extra = r->m_zhdr0 = r->m_zhdr1 = 0; r->m_z_adler32 = r->m_check_adler32 = 1;
  if (decomp_flags & TINFL_FLAG_PARSE_ZLIB_HEADER)
  {
    TINFL_GET_BYTE(1, r->m_zhdr0); TINFL_GET_BYTE(2, r->m_zhdr1);
    counter = (((r->m_zhdr0 * 256 + r->m_zhdr1) % 31 != 0) || (r->m_zhdr1 & 32) || ((r->m_zhdr0 & 15) != 8));
    if (!(decomp_flags & TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF)) counter |= (((1U << (8U + (r->m_zhdr0 >> 4))) > 32768U) || ((out_buf_size_mask + 1) < (size_t)(1U << (8U + (r->m_zhdr0 >> 4)))));
    if (counter) { TINFL_CR_RETURN_FOREVER(36, TINFL_STATUS_FAILED); }
  }

  do
  {
    TINFL_GET_BITS(3, r->m_final, 3); r->m_type = r->m_final >> 1;
    if (r->m_type == 0)
    {
      TINFL_SKIP_BITS(5, num_bits & 7);
      for (counter = 0; counter < 4; ++counter) { if (num_bits) TINFL_GET_BITS(6, r->m_raw_header[counter], 8); else TINFL_GET_BYTE(7, r->m_raw_header[counter]); }
      if ((counter = (r->m_raw_header[0] | (r->m_raw_header[1] << 8))) != (mz_uint)(0xFFFF ^ (r->m_raw_header[2] | (r->m_raw_header[3] << 8)))) { TINFL_CR_RETURN_FOREVER(39, TINFL_STATUS_FAILED); }
      while ((counter) && (num_bits))
      {
        TINFL_GET_BITS(51, dist, 8);
        while (pOut_buf_cur >= pOut_buf_end) { TINFL_CR_RETURN(52, TINFL_STATUS_HAS_MORE_OUTPUT); }
        *pOut_buf_cur++ = (mz_uint8)dist;
        counter--;
      }
      while (counter)
      {
        size_t n; while (pOut_buf_cur >= pOut_buf_end) { TINFL_CR_RETURN(9, TINFL_STATUS_HAS_MORE_OUTPUT); }
        while (pIn_buf_cur >= pIn_buf_end)
        {
          if (decomp_flags & TINFL_FLAG_HAS_MORE_INPUT)
          {
            TINFL_CR_RETURN(38, TINFL_STATUS_NEEDS_MORE_INPUT);
          }
          else
          {
            TINFL_CR_RETURN_FOREVER(40, TINFL_STATUS_FAILED);
          }
        }
        n = MZ_MIN(MZ_MIN((size_t)(pOut_buf_end - pOut_buf_cur), (size_t)(pIn_buf_end - pIn_buf_cur)), counter);
        TINFL_MEMCPY(pOut_buf_cur, pIn_buf_cur, n); pIn_buf_cur += n; pOut_buf_cur += n; counter -= (mz_uint)n;
      }
    }
    else if (r->m_type == 3)
    {
      TINFL_CR_RETURN_FOREVER(10, TINFL_STATUS_FAILED);
    }
    else
    {
      if (r->m_type == 1)
      {
        mz_uint8 *p = r->m_tables[0].m_code_size; mz_uint i;
        r->m_table_sizes[0] = 288; r->m_table_sizes[1] = 32; TINFL_MEMSET(r->m_tables[1].m_code_size, 5, 32);
        for ( i = 0; i <= 143; ++i) *p++ = 8;
        for ( ; i <= 255; ++i) *p++ = 9;
        for ( ; i <= 279; ++i) *p++ = 7;
        for ( ; i <= 287; ++i) *p++ = 8;
      }
      else
      {
        for (counter = 0; counter < 3; counter++) { TINFL_GET_BITS(11, r->m_table_sizes[counter], "\05\05\04"[counter]); r->m_table_sizes[counter] += s_min_table_sizes[counter]; }
        MZ_CLEAR_ARR(r->m_tables[2].m_code_size); for (counter = 0; counter < r->m_table_sizes[2]; counter++) { mz_uint s; TINFL_GET_BITS(14, s, 3); r->m_tables[2].m_code_size[s_length_dezigzag[counter]] = (mz_uint8)s; }
        r->m_table_sizes[2] = 19;
      }
      for ( ; (int)r->m_type >= 0; r->m_type--)
      {
        int tree_next, tree_cur; tinfl_huff_table *pTable;
        mz_uint i, j, used_syms, total, sym_index, next_code[17], total_syms[16]; pTable = &r->m_tables[r->m_type]; MZ_CLEAR_ARR(total_syms); MZ_CLEAR_ARR(pTable->m_look_up); MZ_CLEAR_ARR(pTable->m_tree);
        for (i = 0; i < r->m_table_sizes[r->m_type]; ++i) total_syms[pTable->m_code_size[i]]++;
        used_syms = 0, total = 0; next_code[0] = next_code[1] = 0;
        for (i = 1; i <= 15; ++i) { used_syms += total_syms[i]; next_code[i + 1] = (total = ((total + total_syms[i]) << 1)); }
        if ((65536 != total) && (used_syms > 1))
        {
          TINFL_CR_RETURN_FOREVER(35, TINFL_STATUS_FAILED);
        }
        for (tree_next = -1, sym_index = 0; sym_index < r->m_table_sizes[r->m_type]; ++sym_index)
        {
          mz_uint rev_code = 0, l, cur_code, code_size = pTable->m_code_size[sym_index]; if (!code_size) continue;
          cur_code = next_code[code_size]++; for (l = code_size; l > 0; l--, cur_code >>= 1) rev_code = (rev_code << 1) | (cur_code & 1);
          if (code_size <= TINFL_FAST_LOOKUP_BITS) { mz_int16 k = (mz_int16)((code_size << 9) | sym_index); while (rev_code < TINFL_FAST_LOOKUP_SIZE) { pTable->m_look_up[rev_code] = k; rev_code += (1 << code_size); } continue; }
          if (0 == (tree_cur = pTable->m_look_up[rev_code & (TINFL_FAST_LOOKUP_SIZE - 1)])) { pTable->m_look_up[rev_code & (TINFL_FAST_LOOKUP_SIZE - 1)] = (mz_int16)tree_next; tree_cur = tree_next; tree_next -= 2; }
          rev_code >>= (TINFL_FAST_LOOKUP_BITS - 1);
          for (j = code_size; j > (TINFL_FAST_LOOKUP_BITS + 1); j--)
          {
            tree_cur -= ((rev_code >>= 1) & 1);
            if (!pTable->m_tree[-tree_cur - 1]) { pTable->m_tree[-tree_cur - 1] = (mz_int16)tree_next; tree_cur = tree_next; tree_next -= 2; } else tree_cur = pTable->m_tree[-tree_cur - 1];
          }
          tree_cur -= ((rev_code >>= 1) & 1); pTable->m_tree[-tree_cur - 1] = (mz_int16)sym_index;
        }
        if (r->m_type == 2)
        {
          for (counter = 0; counter < (r->m_table_sizes[0] + r->m_table_sizes[1]); )
          {
            mz_uint s; TINFL_HUFF_DECODE(16, dist, &r->m_tables[2]); if (dist < 16) { r->m_len_codes[counter++] = (mz_uint8)dist; continue; }
            if ((dist == 16) && (!counter))
            {
              TINFL_CR_RETURN_FOREVER(17, TINFL_STATUS_FAILED);
            }
            num_extra = "\02\03\07"[dist - 16]; TINFL_GET_BITS(18, s, num_extra); s += "\03\03\013"[dist - 16];
            TINFL_MEMSET(r->m_len_codes + counter, (dist == 16) ? r->m_len_codes[counter - 1] : 0, s); counter += s;
          }
          if ((r->m_table_sizes[0] + r->m_table_sizes[1]) != counter)
          {
            TINFL_CR_RETURN_FOREVER(21, TINFL_STATUS_FAILED);
          }
          TINFL_MEMCPY(r->m_tables[0].m_code_size, r->m_len_codes, r->m_table_sizes[0]); TINFL_MEMCPY(r->m_tables[1].m_code_size, r->m_len_codes + r->m_table_sizes[0], r->m_table_sizes[1]);
        }
      }
      for ( ; ; )
      {
        mz_uint8 *pSrc;
        for ( ; ; )
        {
          if (((pIn_buf_end - pIn_buf_cur) < 4) || ((pOut_buf_end - pOut_buf_cur) < 2))
          {
            TINFL_HUFF_DECODE(23, counter, &r->m_tables[0]);
            if (counter >= 256)
              break;
            while (pOut_buf_cur >= pOut_buf_end) { TINFL_CR_RETURN(24, TINFL_STATUS_HAS_MORE_OUTPUT); }
            *pOut_buf_cur++ = (mz_uint8)counter;
          }
          else
          {
            int sym2; mz_uint code_len;
#if TINFL_USE_64BIT_BITBUF
            if (num_bits < 30) { bit_buf |= (((tinfl_bit_buf_t)MZ_READ_LE32(pIn_buf_cur)) << num_bits); pIn_buf_cur += 4; num_bits += 32; }
#else
            if (num_bits < 15) { bit_buf |= (((tinfl_bit_buf_t)MZ_READ_LE16(pIn_buf_cur)) << num_bits); pIn_buf_cur += 2; num_bits += 16; }
#endif
            if ((sym2 = r->m_tables[0].m_look_up[bit_buf & (TINFL_FAST_LOOKUP_SIZE - 1)]) >= 0)
              code_len = sym2 >> 9;
            else
            {
              code_len = TINFL_FAST_LOOKUP_BITS; do { sym2 = r->m_tables[0].m_tree[~sym2 + ((bit_buf >> code_len++) & 1)]; } while (sym2 < 0);
            }
            counter = sym2; bit_buf >>= code_len; num_bits -= code_len;
            if (counter & 256)
              break;

#if !TINFL_USE_64BIT_BITBUF
            if (num_bits < 15) { bit_buf |= (((tinfl_bit_buf_t)MZ_READ_LE16(pIn_buf_cur)) << num_bits); pIn_buf_cur += 2; num_bits += 16; }
#endif
            if ((sym2 = r->m_tables[0].m_look_up[bit_buf & (TINFL_FAST_LOOKUP_SIZE - 1)]) >= 0)
              code_len = sym2 >> 9;
            else
            {
              code_len = TINFL_FAST_LOOKUP_BITS; do { sym2 = r->m_tables[0].m_tree[~sym2 + ((bit_buf >> code_len++) & 1)]; } while (sym2 < 0);
            }
            bit_buf >>= code_len; num_bits -= code_len;

            pOut_buf_cur[0] = (mz_uint8)counter;
            if (sym2 & 256)
            {
              pOut_buf_cur++;
              counter = sym2;
              break;
            }
            pOut_buf_cur[1] = (mz_uint8)sym2;
            pOut_buf_cur += 2;
          }
        }
        if ((counter &= 511) == 256) break;

        num_extra = s_length_extra[counter - 257]; counter = s_length_base[counter - 257];
        if (num_extra) { mz_uint extra_bits; TINFL_GET_BITS(25, extra_bits, num_extra); counter += extra_bits; }

        TINFL_HUFF_DECODE(26, dist, &r->m_tables[1]);
        num_extra = s_dist_extra[dist]; dist = s_dist_base[dist];
        if (num_extra) { mz_uint extra_bits; TINFL_GET_BITS(27, extra_bits, num_extra); dist += extra_bits; }

        dist_from_out_buf_start = pOut_buf_cur - pOut_buf_start;
        if ((dist > dist_from_out_buf_start) && (decomp_flags & TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF))
        {
          TINFL_CR_RETURN_FOREVER(37, TINFL_STATUS_FAILED);
        }

        pSrc = pOut_buf_start + ((dist_from_out_buf_start - dist) & out_buf_size_mask);

        if ((MZ_MAX(pOut_buf_cur, pSrc) + counter) > pOut_buf_end)
        {
          while (counter--)
          {
            while (pOut_buf_cur >= pOut_buf_end) { TINFL_CR_RETURN(53, TINFL_STATUS_HAS_MORE_OUTPUT); }
            *pOut_buf_cur++ = pOut_buf_start[(dist_from_out_buf_start++ - dist) & out_buf_size_mask];
          }
          continue;
        }
#if MINIZ_USE_UNALIGNED_LOADS_AND_STORES
        else if ((counter >= 9) && (counter <= dist))
        {
          const mz_uint8 *pSrc_end = pSrc + (counter & ~7);
          do
          {
            ((mz_uint32 *)pOut_buf_cur)[0] = ((const mz_uint32 *)pSrc)[0];
            ((mz_uint32 *)pOut_buf_cur)[1] = ((const mz_uint32 *)pSrc)[1];
            pOut_buf_cur += 8;
          } while ((pSrc += 8) < pSrc_end);
          if ((counter &= 7) < 3)
          {
            if (counter)
            {
              pOut_buf_cur[0] = pSrc[0];
              if (counter > 1)
                pOut_buf_cur[1] = pSrc[1];
              pOut_buf_cur += counter;
            }
            continue;
          }
        }
#endif
        do
        {
          pOut_buf_cur[0] = pSrc[0];
          pOut_buf_cur[1] = pSrc[1];
          pOut_buf_cur[2] = pSrc[2];
          pOut_buf_cur += 3; pSrc += 3;
        } while ((int)(counter -= 3) > 2);
        if ((int)counter > 0)
        {
          pOut_buf_cur[0] = pSrc[0];
          if ((int)counter > 1)
            pOut_buf_cur[1] = pSrc[1];
          pOut_buf_cur += counter;
        }
      }
    }
  } while (!(r->m_final & 1));
  if (decomp_flags & TINFL_FLAG_PARSE_ZLIB_HEADER)
  {
    TINFL_SKIP_BITS(32, num_bits & 7); for (counter = 0; counter < 4; ++counter) { mz_uint s; if (num_bits) TINFL_GET_BITS(41, s, 8); else TINFL_GET_BYTE(42, s); r->m_z_adler32 = (r->m_z_adler32 << 8) | s; }
  }
  TINFL_CR_RETURN_FOREVER(34, TINFL_STATUS_DONE);
  TINFL_CR_FINISH

common_exit:
  r->m_num_bits = num_bits; r->m_bit_buf = bit_buf; r->m_dist = dist; r->m_counter = counter; r->m_num_extra = num_extra; r->m_dist_from_out_buf_start = dist_from_out_buf_start;
  *pIn_buf_size = pIn_buf_cur - pIn_buf_next; *pOut_buf_size = pOut_buf_cur - pOut_buf_next;
  if ((decomp_flags & (TINFL_FLAG_PARSE_ZLIB_HEADER | TINFL_FLAG_COMPUTE_ADLER32)) && (status >= 0))
  {
    const mz_uint8 *ptr = pOut_buf_next; size_t buf_len = *pOut_buf_size;
    mz_uint32 i, s1 = r->m_check_adler32 & 0xffff, s2 = r->m_check_adler32 >> 16; size_t block_len = buf_len % 5552;
    while (buf_len)
    {
      for (i = 0; i + 7 < block_len; i += 8, ptr += 8)
      {
        s1 += ptr[0], s2 += s1; s1 += ptr[1], s2 += s1; s1 += ptr[2], s2 += s1; s1 += ptr[3], s2 += s1;
        s1 += ptr[4], s2 += s1; s1 += ptr[5], s2 += s1; s1 += ptr[6], s2 += s1; s1 += ptr[7], s2 += s1;
      }
      for ( ; i < block_len; ++i) s1 += *ptr++, s2 += s1;
      s1 %= 65521U, s2 %= 65521U; buf_len -= block_len; block_len = 5552;
    }
    r->m_check_adler32 = (s2 << 16) + s1; if ((status == TINFL_STATUS_DONE) && (decomp_flags & TINFL_FLAG_PARSE_ZLIB_HEADER) && (r->m_check_adler32 != r->m_z_adler32)) status = TINFL_STATUS_ADLER32_MISMATCH;
  }
  return status;
}